

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_ObjSetReverseLevel(Abc_Obj_t *pObj,int LevelR)

{
  Abc_Ntk_t *pAVar1;
  Abc_Ntk_t *pNtk;
  int LevelR_local;
  Abc_Obj_t *pObj_local;
  
  pAVar1 = pObj->pNtk;
  if (pAVar1->vLevelsR != (Vec_Int_t *)0x0) {
    Vec_IntFillExtra(pAVar1->vLevelsR,pObj->Id + 1,0);
    Vec_IntWriteEntry(pAVar1->vLevelsR,pObj->Id,LevelR);
    return;
  }
  __assert_fail("pNtk->vLevelsR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                ,0x4be,"void Abc_ObjSetReverseLevel(Abc_Obj_t *, int)");
}

Assistant:

void Abc_ObjSetReverseLevel( Abc_Obj_t * pObj, int LevelR )
{
    Abc_Ntk_t * pNtk = pObj->pNtk;
    assert( pNtk->vLevelsR );
    Vec_IntFillExtra( pNtk->vLevelsR, pObj->Id + 1, 0 );
    Vec_IntWriteEntry( pNtk->vLevelsR, pObj->Id, LevelR );
}